

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u32 jsonCreateEditSubstructure(JsonParse *pParse,JsonParse *pIns,char *zTail)

{
  u32 uVar1;
  
  pIns->bJsonIsRCStr = '\0';
  pIns->hasNonstd = '\0';
  pIns->bReadOnly = '\0';
  pIns->eEdit = '\0';
  pIns->delta = 0;
  pIns->nIns = 0;
  pIns->iLabel = 0;
  pIns->nJson = 0;
  pIns->nJPRef = 0;
  pIns->iErr = 0;
  pIns->iDepth = 0;
  pIns->nErr = '\0';
  pIns->oom = '\0';
  pIns->zJson = (char *)0x0;
  pIns->db = (sqlite3 *)0x0;
  pIns->aBlob = (u8 *)0x0;
  pIns->nBlob = 0;
  pIns->nBlobAlloc = 0;
  pIns->aIns = (u8 *)0x0;
  pIns->db = pParse->db;
  if (*zTail == '\0') {
    pIns->aBlob = pParse->aIns;
    pIns->nBlob = pParse->nIns;
    uVar1 = 0;
  }
  else {
    pIns->nBlob = 1;
    pIns->aBlob = "\v\f" + (*zTail == '.');
    pIns->eEdit = pParse->eEdit;
    pIns->nIns = pParse->nIns;
    pIns->aIns = pParse->aIns;
    uVar1 = jsonLookupStep(pIns,0,zTail,0);
    pParse->oom = pParse->oom | pIns->oom;
  }
  return uVar1;
}

Assistant:

static u32 jsonCreateEditSubstructure(
  JsonParse *pParse,  /* The original JSONB that is being edited */
  JsonParse *pIns,    /* Populate this with the blob data to insert */
  const char *zTail   /* Tail of the path that determins substructure */
){
  static const u8 emptyObject[] = { JSONB_ARRAY, JSONB_OBJECT };
  int rc;
  memset(pIns, 0, sizeof(*pIns));
  pIns->db = pParse->db;
  if( zTail[0]==0 ){
    /* No substructure.  Just insert what is given in pParse. */
    pIns->aBlob = pParse->aIns;
    pIns->nBlob = pParse->nIns;
    rc = 0;
  }else{
    /* Construct the binary substructure */
    pIns->nBlob = 1;
    pIns->aBlob = (u8*)&emptyObject[zTail[0]=='.'];
    pIns->eEdit = pParse->eEdit;
    pIns->nIns = pParse->nIns;
    pIns->aIns = pParse->aIns;
    rc = jsonLookupStep(pIns, 0, zTail, 0);
    pParse->oom |= pIns->oom;
  }
  return rc;  /* Error code only */
}